

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractStringValidator.cpp
# Opt level: O0

void __thiscall
xercesc_4_0::AbstractStringValidator::normalizeEnumeration
          (AbstractStringValidator *this,MemoryManager *manager)

{
  short sVar1;
  uint uVar2;
  DatatypeValidator *this_00;
  BaseRefVectorOf<char16_t> *pBVar3;
  XMLSize_t XVar4;
  char16_t *pcVar5;
  XMLSize_t local_48;
  XMLSize_t i_1;
  XMLSize_t enumLength_1;
  XMLSize_t i;
  XMLSize_t enumLength;
  short whiteSpace;
  int baseFacetsDefined;
  AbstractStringValidator *pBaseValidator;
  MemoryManager *manager_local;
  AbstractStringValidator *this_local;
  
  this_00 = DatatypeValidator::getBaseValidator(&this->super_DatatypeValidator);
  if ((((this->fEnumeration != (RefArrayVectorOf<char16_t> *)0x0) &&
       (this_00 != (DatatypeValidator *)0x0)) &&
      (uVar2 = DatatypeValidator::getFacetsDefined(this_00), (uVar2 & 0x4000) != 0)) &&
     (sVar1 = DatatypeValidator::getWSFacet(this_00), sVar1 != 0)) {
    if (sVar1 == 1) {
      pBVar3 = &getEnumeration(this)->super_BaseRefVectorOf<char16_t>;
      XVar4 = BaseRefVectorOf<char16_t>::size(pBVar3);
      for (enumLength_1 = 0; enumLength_1 < XVar4; enumLength_1 = enumLength_1 + 1) {
        pBVar3 = &getEnumeration(this)->super_BaseRefVectorOf<char16_t>;
        pcVar5 = BaseRefVectorOf<char16_t>::elementAt(pBVar3,enumLength_1);
        XMLString::replaceWS(pcVar5,manager);
      }
    }
    else if (sVar1 == 2) {
      pBVar3 = &getEnumeration(this)->super_BaseRefVectorOf<char16_t>;
      XVar4 = BaseRefVectorOf<char16_t>::size(pBVar3);
      for (local_48 = 0; local_48 < XVar4; local_48 = local_48 + 1) {
        pBVar3 = &getEnumeration(this)->super_BaseRefVectorOf<char16_t>;
        pcVar5 = BaseRefVectorOf<char16_t>::elementAt(pBVar3,local_48);
        XMLString::collapseWS(pcVar5,manager);
      }
    }
  }
  return;
}

Assistant:

void AbstractStringValidator::normalizeEnumeration(MemoryManager* const manager)
{
    AbstractStringValidator *pBaseValidator = (AbstractStringValidator*) getBaseValidator();

    if (!fEnumeration || !pBaseValidator)
        return;

    int baseFacetsDefined = pBaseValidator->getFacetsDefined();
    if ((baseFacetsDefined & DatatypeValidator::FACET_WHITESPACE) == 0)
        return;

    short whiteSpace = pBaseValidator->getWSFacet();

    if ( whiteSpace == DatatypeValidator::PRESERVE )
    {
        return;
    }
    else if ( whiteSpace == DatatypeValidator::REPLACE )
    {
        XMLSize_t enumLength = getEnumeration()->size();
        for ( XMLSize_t i=0; i < enumLength; i++)
        {
            XMLString::replaceWS(getEnumeration()->elementAt(i), manager);
        }
    }
    else if ( whiteSpace == DatatypeValidator::COLLAPSE )
    {
        XMLSize_t enumLength = getEnumeration()->size();
        for ( XMLSize_t i=0; i < enumLength; i++)
        {
            XMLString::collapseWS(getEnumeration()->elementAt(i), manager);
        }
    }
}